

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_cabac.c
# Opt level: O2

int h264_cabac_ueg(bitstream *str,h264_cabac_context *cabac,int *ctxIdx,int numidx,int k,int sign,
                  uint32_t uCoff,int32_t *val)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint32_t tmp;
  int local_38;
  uint local_34;
  
  uVar5 = *val;
  local_34 = -uVar5;
  if (0 < (int)uVar5) {
    local_34 = uVar5;
  }
  if (uCoff <= local_34) {
    local_34 = uCoff;
  }
  iVar1 = h264_cabac_tu(str,cabac,ctxIdx,numidx,uCoff,&local_34);
  iVar3 = 1;
  if (iVar1 == 0) {
    uVar5 = local_34;
    local_38 = sign;
    if (uCoff <= local_34) {
      if (str->dir == VS_ENCODE) {
        uVar2 = *val;
        uVar5 = -uVar2;
        if (0 < (int)uVar2) {
          uVar5 = uVar2;
        }
        tmp = 1;
        uVar2 = uVar5 - uCoff;
        for (; uVar4 = 1 << ((byte)k & 0x1f), uVar4 <= uVar2; k = k + 1) {
          iVar3 = h264_cabac_bypass(str,cabac,&tmp);
          if (iVar3 != 0) {
            return 1;
          }
          uVar2 = uVar2 - uVar4;
        }
        tmp = 0;
        iVar3 = h264_cabac_bypass(str,cabac,&tmp);
        while( true ) {
          if (iVar3 != 0) {
            return 1;
          }
          k = k - 1;
          if (k == 0xffffffff) break;
          tmp = (uint32_t)((uVar2 >> (k & 0x1fU) & 1) != 0);
          iVar3 = h264_cabac_bypass(str,cabac,&tmp);
        }
      }
      else {
        while( true ) {
          iVar3 = h264_cabac_bypass(str,cabac,&tmp);
          if (iVar3 != 0) {
            return 1;
          }
          if (tmp == 0) break;
          uVar5 = uVar5 + (1 << ((byte)k & 0x1f));
          k = k + 1;
        }
        while (k = k + -1, k != -1) {
          iVar3 = h264_cabac_bypass(str,cabac,&tmp);
          if (iVar3 != 0) {
            return 1;
          }
          uVar5 = uVar5 + (tmp << ((byte)k & 0x1f));
        }
      }
    }
    iVar3 = 1;
    if ((local_38 == 0) || (uVar5 == 0)) {
      iVar3 = 0;
      if (str->dir == VS_DECODE) {
        *val = uVar5;
      }
    }
    else {
      tmp = (uint)*val >> 0x1f;
      iVar1 = h264_cabac_bypass(str,cabac,&tmp);
      if (iVar1 == 0) {
        if (str->dir == VS_DECODE) {
          uVar2 = -uVar5;
          if (tmp == 0) {
            uVar2 = uVar5;
          }
          *val = uVar2;
        }
        iVar3 = 0;
      }
    }
  }
  return iVar3;
}

Assistant:

int h264_cabac_ueg(struct bitstream *str, struct h264_cabac_context *cabac, int *ctxIdx, int numidx, int k, int sign, uint32_t uCoff, int32_t *val) {
	uint32_t tuval = abs(*val);
	if (tuval > uCoff)
		tuval = uCoff;
	if (h264_cabac_tu(str, cabac, ctxIdx, numidx, uCoff, &tuval)) return 1;
	uint32_t rval = tuval;
	if (tuval >= uCoff) {
		if (str->dir == VS_ENCODE) {
			rval = abs(*val);
			uint32_t sufS = rval - uCoff;
			uint32_t tmp = 1;
			while (sufS >= (1 << k)) {
				if (h264_cabac_bypass(str, cabac, &tmp)) return 1;
				sufS -= 1 << k;
				k++;
			}
			tmp = 0;
			if (h264_cabac_bypass(str, cabac, &tmp)) return 1;
			while (k--) {
				tmp = sufS >> k & 1;
				if (h264_cabac_bypass(str, cabac, &tmp)) return 1;
			}
		} else {
			uint32_t tmp;
			while (1) {
				if (h264_cabac_bypass(str, cabac, &tmp)) return 1;
				if (!tmp)
					break;
				rval += 1 << k;
				k++;
			}
			while (k--) {
				if (h264_cabac_bypass(str, cabac, &tmp)) return 1;
				rval += tmp << k;
			}
		}
	}
	if (rval && sign) {
		uint32_t s = *val < 0;
		if (h264_cabac_bypass(str, cabac, &s)) return 1;
		if (str->dir == VS_DECODE) {
			if (s)
				*val = -rval;
			else
				*val = rval;
		}
	} else {
		if (str->dir == VS_DECODE)
			*val = rval;
	}
	return 0;
}